

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrintColorEncoded(char *str)

{
  byte bVar1;
  GTestColor GVar2;
  GTestColor color;
  char *__s;
  char *pcVar3;
  long *local_50 [2];
  long local_40 [2];
  
  __s = 
  "This program contains tests written using Google Test. You can use the\nfollowing command line flags to control its behavior:\n\nTest Selection:\n  @G--gtest_list_tests@D\n      List the names of all tests instead of running them. The name of\n      TEST(Foo, Bar) is \"Foo.Bar\".\n  @G--gtest_filter=@YPOSITIVE_PATTERNS[@G-@YNEGATIVE_PATTERNS]@D\n      Run only the tests whose name matches one of the positive patterns but\n      none of the negative patterns. \'?\' matches any single character; \'*\'\n      matches any substring; \':\' separates two patterns.\n  @G--gtest_also_run_disabled_tests@D\n      Run all disabled tests too.\n\nTest Execution:\n  @G--gtest_repeat=@Y[COUNT]@D\n      Run the tests repeatedly; use a negative count to repeat forever.\n  @G--gtest_shuffle@D\n      Randomize tests\' orders on every iteration.\n  @G--gtest_random_seed=@Y[NUMBER]@D\n      Random number seed to use for shuffling test orders (between 1 and\n      99999, or 0 to use a seed based on the current time).\n\nTest Output:\n  @G--gtest_color=@Y(@Gyes@Y|@Gno@Y|@Gauto@Y)@D\n      Enable/disable colored output. The default is @Gauto@D.\n  @G--gtest_brief=1@D\n      Only print test failures.\n  @G--gtest_print_time=0@D\n      Don\'t print the elapsed time of each test.\n  @G--gtest_output=@Y(@Gjson@Y|@Gxml@Y)[@G:@YDIRECTORY_PATH@G/@Y|@G:@YFILE_PATH]@D\n      Generate a JSON or XML report in the given directory or with the given\n      file name. @YFILE_PATH@D defaults to @Gtest_detail.xml@D.\n  @G--gtest_stream_result_to=@YHOST@G:@YPORT@D\n      Stream test results to the given server.\n\nAssertion Behavior:\n  @G--gtest_death_test_style=@Y(@Gfast@Y|@Gthreadsafe@Y)@D\n      Set the default death test style.\n  @G--gtest_break_on_failure@D\n      Turn assertion failures into debugger break-points.\n  @G--gtest_throw_on_failure@D\n      Turn assertion failures into C++ exceptions for use by an external\n      test framework.\n  @G--gtest_catch_exceptions=0@D\n      Do not report exceptions as test failures. Instead, allow them\n      to crash the program or throw a pop-up (on Windows)...." /* TRUNCATED STRING LITERAL */
  ;
  pcVar3 = 
  "@G--gtest_list_tests@D\n      List the names of all tests instead of running them. The name of\n      TEST(Foo, Bar) is \"Foo.Bar\".\n  @G--gtest_filter=@YPOSITIVE_PATTERNS[@G-@YNEGATIVE_PATTERNS]@D\n      Run only the tests whose name matches one of the positive patterns but\n      none of the negative patterns. \'?\' matches any single character; \'*\'\n      matches any substring; \':\' separates two patterns.\n  @G--gtest_also_run_disabled_tests@D\n      Run all disabled tests too.\n\nTest Execution:\n  @G--gtest_repeat=@Y[COUNT]@D\n      Run the tests repeatedly; use a negative count to repeat forever.\n  @G--gtest_shuffle@D\n      Randomize tests\' orders on every iteration.\n  @G--gtest_random_seed=@Y[NUMBER]@D\n      Random number seed to use for shuffling test orders (between 1 and\n      99999, or 0 to use a seed based on the current time).\n\nTest Output:\n  @G--gtest_color=@Y(@Gyes@Y|@Gno@Y|@Gauto@Y)@D\n      Enable/disable colored output. The default is @Gauto@D.\n  @G--gtest_brief=1@D\n      Only print test failures.\n  @G--gtest_print_time=0@D\n      Don\'t print the elapsed time of each test.\n  @G--gtest_output=@Y(@Gjson@Y|@Gxml@Y)[@G:@YDIRECTORY_PATH@G/@Y|@G:@YFILE_PATH]@D\n      Generate a JSON or XML report in the given directory or with the given\n      file name. @YFILE_PATH@D defaults to @Gtest_detail.xml@D.\n  @G--gtest_stream_result_to=@YHOST@G:@YPORT@D\n      Stream test results to the given server.\n\nAssertion Behavior:\n  @G--gtest_death_test_style=@Y(@Gfast@Y|@Gthreadsafe@Y)@D\n      Set the default death test style.\n  @G--gtest_break_on_failure@D\n      Turn assertion failures into debugger break-points.\n  @G--gtest_throw_on_failure@D\n      Turn assertion failures into C++ exceptions for use by an external\n      test framework.\n  @G--gtest_catch_exceptions=0@D\n      Do not report exceptions as test failures. Instead, allow them\n      to crash the program or throw a pop-up (on Windows).\n\nExcept for @G--gtest_list_tests@D, you can alternatively set the corresponding\nenvironment variable of a flag (all letters in upper-case). For..." /* TRUNCATED STRING LITERAL */
  ;
  color = kDefault;
  do {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,pcVar3);
    ColoredPrintf(color,"%s",local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    bVar1 = pcVar3[1];
    __s = pcVar3 + 2;
    if (bVar1 < 0x47) {
      if (bVar1 == 0x40) {
        ColoredPrintf(color,"@");
        GVar2 = color;
      }
      else {
        GVar2 = kDefault;
        if (bVar1 != 0x44) {
LAB_0012d510:
          __s = pcVar3 + 1;
          GVar2 = color;
        }
      }
    }
    else if (bVar1 == 0x47) {
      GVar2 = kGreen;
    }
    else if (bVar1 == 0x52) {
      GVar2 = kRed;
    }
    else {
      if (bVar1 != 0x59) goto LAB_0012d510;
      GVar2 = kYellow;
    }
    color = GVar2;
    pcVar3 = strchr(__s,0x40);
    if (pcVar3 == (char *)0x0) {
      ColoredPrintf(color,"%s",__s);
      return;
    }
  } while( true );
}

Assistant:

static void PrintColorEncoded(const char* str) {
  GTestColor color = GTestColor::kDefault;  // The current color.

  // Conceptually, we split the string into segments divided by escape
  // sequences.  Then we print one segment at a time.  At the end of
  // each iteration, the str pointer advances to the beginning of the
  // next segment.
  for (;;) {
    const char* p = strchr(str, '@');
    if (p == nullptr) {
      ColoredPrintf(color, "%s", str);
      return;
    }

    ColoredPrintf(color, "%s", std::string(str, p).c_str());

    const char ch = p[1];
    str = p + 2;
    if (ch == '@') {
      ColoredPrintf(color, "@");
    } else if (ch == 'D') {
      color = GTestColor::kDefault;
    } else if (ch == 'R') {
      color = GTestColor::kRed;
    } else if (ch == 'G') {
      color = GTestColor::kGreen;
    } else if (ch == 'Y') {
      color = GTestColor::kYellow;
    } else {
      --str;
    }
  }
}